

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_simcontext.cpp
# Opt level: O2

int __thiscall
sc_core::sc_process_table::queue<sc_core::sc_thread_process_*>::remove
          (queue<sc_core::sc_thread_process_*> *this,char *__filename)

{
  queue<sc_core::sc_thread_process_*> qVar1;
  queue<sc_core::sc_thread_process_*> qVar2;
  sc_process_b **ppsVar3;
  
  qVar2.m_head = (sc_thread_process *)0x0;
  ppsVar3 = (sc_process_b **)this;
  while( true ) {
    qVar1.m_head = (sc_thread_process *)*ppsVar3;
    if (qVar1.m_head == (sc_thread_process *)0x0) {
      return 0;
    }
    if (qVar1.m_head == (sc_thread_process *)__filename) break;
    ppsVar3 = &((qVar1.m_head)->super_sc_process_b).m_exist_p;
    qVar2.m_head = qVar1.m_head;
  }
  ppsVar3 = &((qVar2.m_head)->super_sc_process_b).m_exist_p;
  if (qVar2.m_head == (sc_thread_process *)0x0) {
    ppsVar3 = (sc_process_b **)this;
  }
  *ppsVar3 = ((qVar1.m_head)->super_sc_process_b).m_exist_p;
  return (int)__filename;
}

Assistant:

ProcessHandle
sc_process_table::queue<ProcessHandle>::remove( ProcessHandle handle )
{
    ProcessHandle now_p   = m_head; // Entry now examining.
    ProcessHandle prior_p = NULL;   // Entry prior to one now examining.

    while( now_p )
    {
        if ( now_p == handle )
        {
            if ( prior_p )
                prior_p->set_next_exist( now_p->next_exist() );
            else
                m_head = now_p->next_exist();
            return handle;
        }
        prior_p = now_p;
        now_p   = now_p->next_exist();
    }
    return NULL;
}